

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_31(QPDF *pdf,char *arg2)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  allocator<char> local_ca;
  allocator<char> local_c9;
  allocator<char> local_c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  string local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator<char> local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70 [3];
  QPDFObjectHandle o2;
  QPDFObjectHandle o1;
  string local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  string local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  operator____qpdf((char *)&o1,0x13d2bf);
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_98);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"   12345 \f  ",local_78);
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"",local_c8);
  QPDFObjectHandle::parse((string *)&o2,(string *)&local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  cVar1 = QPDFObjectHandle::isInteger();
  if (cVar1 != '\0') {
    lVar4 = QPDFObjectHandle::getIntValue();
    if (lVar4 == 0x3039) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"[1 0 R]",local_78);
      std::__cxx11::string::string<std::allocator<char>>(local_b8,"indirect test",local_c8);
      QPDFObjectHandle::parse(local_28,(string *)&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string((string *)&local_98);
      poVar3 = std::operator<<((ostream *)&std::cout,"oops -- didn\'t throw");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"0 trailing",local_78);
      std::__cxx11::string::string<std::allocator<char>>(local_b8,"trailing test",local_c8);
      QPDFObjectHandle::parse(local_38,(string *)&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string((string *)&local_98);
      poVar3 = std::operator<<((ostream *)&std::cout,"oops -- didn\'t throw");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"[5 0 R]",&local_ca);
      std::__cxx11::string::string<std::allocator<char>>(local_b8,"",&local_c9);
      QPDFObjectHandle::parse((QPDF *)local_c8,(string *)pdf,(string *)&local_98);
      QPDFObjectHandle::getArrayItem((int)local_78);
      cVar1 = QPDFObjectHandle::isInteger();
      if (cVar1 == '\0') {
        __assert_fail("QPDFObjectHandle::parse(&pdf, \"[5 0 R]\").getArrayItem(0).isInteger()",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x4a6,"void test_31(QPDF &, const char *)");
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"[5 0 R]",&local_ca);
      std::__cxx11::string::string<std::allocator<char>>(local_b8,"",&local_c9);
      QPDFObjectHandle::parse((QPDF *)local_c8,(string *)pdf,(string *)&local_98);
      QPDFObjectHandle::getArrayItem((int)local_78);
      cVar1 = QPDFObjectHandle::isDirectNull();
      if (cVar1 != '\0') {
        __assert_fail("!QPDFObjectHandle::parse(&pdf, \"[5 0 R]\").getArrayItem(0).isDirectNull()",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x4a7,"void test_31(QPDF &, const char *)");
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::string<std::allocator<char>>(local_b8,"[5 0 R 0 R /X]",&local_ca);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"",&local_c9);
      QPDFObjectHandle::parse((QPDF *)local_c8,(string *)pdf,local_b8);
      QPDFObjectHandle::unparse_abi_cxx11_();
      bVar2 = std::operator==(&local_98,"[ 5 0 R 0 (R) /X ]");
      if (!bVar2) {
        __assert_fail("QPDFObjectHandle::parse(&pdf, \"[5 0 R 0 R /X]\").unparse() == \"[ 5 0 R 0 (R) /X ]\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x4aa,"void test_31(QPDF &, const char *)");
      }
      std::__cxx11::string::~string((string *)&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
      std::__cxx11::string::~string((string *)local_78);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::string<std::allocator<char>>(local_b8,"[1 0 R]",&local_ca);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_78,"indirect test",&local_c9);
      QPDFObjectHandle::parse((QPDF *)local_c8,(string *)pdf,local_b8);
      QPDFObjectHandle::unparse_abi_cxx11_();
      bVar2 = std::operator==(&local_98,"[ 1 0 R ]");
      if (!bVar2) {
        __assert_fail("QPDFObjectHandle::parse(&pdf, \"[1 0 R]\", \"indirect test\").unparse() == \"[ 1 0 R ]\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x4ab,"void test_31(QPDF &, const char *)");
      }
      std::__cxx11::string::~string((string *)&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
      std::__cxx11::string::~string((string *)local_78);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::string<std::allocator<char>>(local_b8,"}",&local_ca);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"",&local_c9);
      QPDFObjectHandle::parse((QPDF *)local_c8,(string *)pdf,local_b8);
      QPDFObjectHandle::unparse_abi_cxx11_();
      bVar2 = std::operator==(&local_98,"null");
      if (!bVar2) {
        __assert_fail("QPDFObjectHandle::parse(&pdf, \"}\").unparse() == \"null\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x4ad,"void test_31(QPDF &, const char *)");
      }
      std::__cxx11::string::~string((string *)&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
      std::__cxx11::string::~string((string *)local_78);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::string<std::allocator<char>>(local_b8,"{",&local_ca);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"",&local_c9);
      QPDFObjectHandle::parse((QPDF *)local_c8,(string *)pdf,local_b8);
      QPDFObjectHandle::unparse_abi_cxx11_();
      bVar2 = std::operator==(&local_98,"null");
      if (!bVar2) {
        __assert_fail("QPDFObjectHandle::parse(&pdf, \"{\").unparse() == \"null\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x4ae,"void test_31(QPDF &, const char *)");
      }
      std::__cxx11::string::~string((string *)&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
      std::__cxx11::string::~string((string *)local_78);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::string<std::allocator<char>>(local_b8,">>",&local_ca);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"",&local_c9);
      QPDFObjectHandle::parse((QPDF *)local_c8,(string *)pdf,local_b8);
      QPDFObjectHandle::unparse_abi_cxx11_();
      bVar2 = std::operator==(&local_98,"null");
      if (!bVar2) {
        __assert_fail("QPDFObjectHandle::parse(&pdf, \">>\").unparse() == \"null\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x4b0,"void test_31(QPDF &, const char *)");
      }
      std::__cxx11::string::~string((string *)&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
      std::__cxx11::string::~string((string *)local_78);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"[7 0 R]",&local_ca);
      std::__cxx11::string::string<std::allocator<char>>(local_b8,"",&local_c9);
      QPDFObjectHandle::parse((QPDF *)local_c8,(string *)pdf,(string *)&local_98);
      QPDFObjectHandle::getArrayItem((int)local_78);
      cVar1 = QPDFObjectHandle::isNull();
      if (cVar1 != '\0') {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_70);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
        std::__cxx11::string::~string(local_b8);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"[7 0 R]",&local_ca);
        std::__cxx11::string::string<std::allocator<char>>(local_b8,"",&local_c9);
        QPDFObjectHandle::parse((QPDF *)local_c8,(string *)pdf,(string *)&local_98);
        QPDFObjectHandle::getArrayItem((int)local_78);
        cVar1 = QPDFObjectHandle::isDirectNull();
        if (cVar1 != '\0') {
          __assert_fail("!QPDFObjectHandle::parse(&pdf, \"[7 0 R]\").getArrayItem(0).isDirectNull()"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x4b3,"void test_31(QPDF &, const char *)");
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_70);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
        std::__cxx11::string::~string(local_b8);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"null",local_c8);
        std::__cxx11::string::string<std::allocator<char>>(local_b8,"",&local_ca);
        QPDFObjectHandle::parse((QPDF *)local_78,(string *)pdf,(string *)&local_98);
        cVar1 = QPDFObjectHandle::isDirectNull();
        if (cVar1 != '\0') {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_70);
          std::__cxx11::string::~string(local_b8);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_b8,"[0 0 R -1 0 R 1 65535 R 1 100000 R 1 -1 R]",&local_ca);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"",&local_c9);
          QPDFObjectHandle::parse((QPDF *)local_c8,(string *)pdf,local_b8);
          QPDFObjectHandle::unparse_abi_cxx11_();
          bVar2 = std::operator==(&local_98,"[ null null null null null ]");
          if (bVar2) {
            std::__cxx11::string::~string((string *)&local_98);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
            std::__cxx11::string::~string((string *)local_78);
            std::__cxx11::string::~string(local_b8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&o2.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&o1.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            return;
          }
          __assert_fail("QPDFObjectHandle::parse(&pdf, \"[0 0 R -1 0 R 1 65535 R 1 100000 R 1 -1 R]\").unparse() == \"[ null null null null null ]\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x4b8,"void test_31(QPDF &, const char *)");
        }
        __assert_fail("QPDFObjectHandle::parse(&pdf, \"null\").isDirectNull()",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x4b4,"void test_31(QPDF &, const char *)");
      }
      __assert_fail("QPDFObjectHandle::parse(&pdf, \"[7 0 R]\").getArrayItem(0).isNull()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x4b2,"void test_31(QPDF &, const char *)");
    }
  }
  __assert_fail("o2.isInteger() && (o2.getIntValue() == 12345)",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x499,"void test_31(QPDF &, const char *)");
}

Assistant:

static void
test_31(QPDF& pdf, char const* arg2)
{
    auto o1 = "[/name 16059 3.14159 false\n"
              " << /key true /other [ (string1) (string2) ] >> null]"_qpdf;
    std::cout << o1.unparse() << std::endl;
    QPDFObjectHandle o2 = QPDFObjectHandle::parse("   12345 \f  ");
    assert(o2.isInteger() && (o2.getIntValue() == 12345));
    try {
        QPDFObjectHandle::parse("[1 0 R]", "indirect test");
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error parsing indirect: " << e.what() << std::endl;
    }
    try {
        QPDFObjectHandle::parse("0 trailing", "trailing test");
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::runtime_error const& e) {
        std::cout << "trailing data: " << e.what() << std::endl;
    }
    assert(QPDFObjectHandle::parse(&pdf, "[5 0 R]").getArrayItem(0).isInteger());
    assert(!QPDFObjectHandle::parse(&pdf, "[5 0 R]").getArrayItem(0).isDirectNull());
    // Make sure an indirect integer followed by "0 R" is not
    // mistakenly parsed as an indirect object.
    assert(QPDFObjectHandle::parse(&pdf, "[5 0 R 0 R /X]").unparse() == "[ 5 0 R 0 (R) /X ]");
    assert(QPDFObjectHandle::parse(&pdf, "[1 0 R]", "indirect test").unparse() == "[ 1 0 R ]");
    // TC:QPDFParser bad brace
    assert(QPDFObjectHandle::parse(&pdf, "}").unparse() == "null");
    assert(QPDFObjectHandle::parse(&pdf, "{").unparse() == "null");
    // TC:QPDFParser bad dictionary close
    assert(QPDFObjectHandle::parse(&pdf, ">>").unparse() == "null");
    // TC:QPDFParser eof in parse
    assert(QPDFObjectHandle::parse(&pdf, "[7 0 R]").getArrayItem(0).isNull());
    assert(!QPDFObjectHandle::parse(&pdf, "[7 0 R]").getArrayItem(0).isDirectNull());
    assert(QPDFObjectHandle::parse(&pdf, "null").isDirectNull());
    // TC:QPDFParser invalid objgen
    assert(
        QPDFObjectHandle::parse(&pdf, "[0 0 R -1 0 R 1 65535 R 1 100000 R 1 -1 R]").unparse() ==
        "[ null null null null null ]");
}